

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Generators_Uniform1DSeed_Test::TestBody(Generators_Uniform1DSeed_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  char *message;
  uint64_t oldstate;
  undefined1 *puVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  Float u_1;
  vector<float,_std::allocator<float>_> samples;
  Float u;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  float local_6c;
  void *local_68;
  iterator iStack_60;
  float *local_58;
  float local_48 [2];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  
  iVar5 = 0x4e2;
  puVar6 = &DAT_5851f42d4c957f2e;
  local_68 = (void *)0x0;
  iStack_60._M_current = (float *)0x0;
  local_58 = (float *)0x0;
  do {
    uVar3 = (uint)((ulong)puVar6 >> 0x2d) ^ (uint)((ulong)puVar6 >> 0x1b);
    bVar4 = (byte)((ulong)puVar6 >> 0x3b);
    auVar1 = vcvtusi2ss_avx512f(in_XMM1,uVar3 >> bVar4 | uVar3 << 0x20 - bVar4);
    auVar1 = vminss_avx(ZEXT416((uint)(auVar1._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    local_48[0] = auVar1._0_4_;
    if (iStack_60._M_current == local_58) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)&local_68,iStack_60,local_48);
    }
    else {
      *iStack_60._M_current = local_48[0];
      iStack_60._M_current = iStack_60._M_current + 1;
    }
    puVar6 = (undefined1 *)((long)puVar6 * 0x5851f42d4c957f2d + 1);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  if ((int)((ulong)((long)iStack_60._M_current - (long)local_68) >> 2) != 0) {
    uVar7 = 0xd67e3ce66fa9db2d;
    lVar8 = 0;
    uVar9 = (ulong)((long)iStack_60._M_current - (long)local_68) >> 2 & 0xffffffff;
    do {
      uVar3 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
      bVar4 = (byte)(uVar7 >> 0x3b);
      auVar1 = vcvtusi2ss_avx512f(in_XMM1,uVar3 >> bVar4 | uVar3 << 0x20 - bVar4);
      auVar1 = vminss_avx(ZEXT416((uint)(auVar1._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      local_6c = auVar1._0_4_;
      testing::internal::CmpHelperNE<float,float>
                ((internal *)local_48,"u","samples[i]",&local_6c,(float *)((long)local_68 + lVar8));
      if (local_48[0]._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        message = "";
        if (local_40.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_40.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x445,message);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (((local_78.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_78.ptr_ + 8))();
          in_XMM1._8_8_ = extraout_XMM1_Qb;
          in_XMM1._0_8_ = extraout_XMM1_Qa;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar8 = lVar8 + 4;
      uVar7 = uVar7 * 0x5851f42d4c957f2d + 3;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return;
}

Assistant:

TEST(Generators, Uniform1DSeed) {
    std::vector<Float> samples;
    for (Float u : Uniform1D(1250))
        samples.push_back(u);

    // Different seed
    int i = 0;
    for (Float u : Uniform1D(samples.size(), 1)) {
        EXPECT_NE(u, samples[i]);
        ++i;
    }
}